

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

sunrealtype N_VWrmsNorm_ManyVector(N_Vector x,N_Vector w)

{
  sunrealtype sVar1;
  double dVar2;
  
  sVar1 = N_VWSqrSumLocal_ManyVector(x,w);
  dVar2 = sVar1 / (double)*(long *)((long)x->content + 8);
  sVar1 = 0.0;
  if (0.0 < dVar2) {
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
      return dVar2;
    }
    sVar1 = SQRT(dVar2);
  }
  return sVar1;
}

Assistant:

sunrealtype MVAPPEND(N_VWrmsNorm)(N_Vector x, N_Vector w)
{
  SUNFunctionBegin(x->sunctx);
  sunrealtype gsum;
#ifdef MANYVECTOR_BUILD_WITH_MPI
  sunrealtype lsum;
  lsum = gsum = N_VWSqrSumLocal_MPIManyVector(x, w);
  SUNCheckLastErrNoRet();
  if (MANYVECTOR_COMM(x) != MPI_COMM_NULL)
  {
    SUNCheckMPICallNoRet(MPI_Allreduce(&lsum, &gsum, 1, MPI_SUNREALTYPE,
                                       MPI_SUM, MANYVECTOR_COMM(x)));
  }
#else
  gsum = N_VWSqrSumLocal_ManyVector(x, w);
  SUNCheckLastErrNoRet();
#endif
  return (SUNRsqrt(gsum / (MANYVECTOR_GLOBLENGTH(x))));
}